

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socksd.c
# Opt level: O0

int main(int argc,char **argv)

{
  uint __errnum;
  unsigned_long uVar1;
  int iVar2;
  ulong ulnum_00;
  size_t sVar3;
  uint *puVar4;
  char *pcVar5;
  unsigned_long ulnum;
  char *endptr;
  uint local_38;
  int arg;
  int error;
  _Bool juggle_again;
  char *pidname;
  int local_20;
  int wrotepidfile;
  curl_socket_t msgsock;
  curl_socket_t sock;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  wrotepidfile = -1;
  local_20 = -1;
  pidname._4_4_ = 0;
  _error = ".socksd.pid";
  endptr._4_4_ = 1;
  iVar2 = endptr._4_4_;
  _msgsock = argv;
  argv_local._0_4_ = argc;
  while( true ) {
    endptr._4_4_ = iVar2;
    if ((int)argv_local <= endptr._4_4_) {
      install_signal_handlers();
      if ((use_ipv6 & 1U) == 0) {
        wrotepidfile = socket(2,1,0);
      }
      else {
        wrotepidfile = socket(10,1,0);
      }
      if (wrotepidfile == -1) {
        puVar4 = (uint *)__errno_location();
        __errnum = *puVar4;
        local_38 = __errnum;
        pcVar5 = strerror(__errnum);
        logmsg("Error creating socket: (%d) %s",(ulong)__errnum,pcVar5);
      }
      else {
        wrotepidfile = sockdaemon(wrotepidfile,&port);
        if (wrotepidfile != -1) {
          local_20 = -1;
          logmsg("Running %s version",ipv_inuse);
          logmsg("Listening on port %hu",(ulong)port);
          pidname._4_4_ = write_pidfile(_error);
          if (pidname._4_4_ != 0) {
            do {
              arg._3_1_ = incoming(wrotepidfile);
            } while ((bool)arg._3_1_);
          }
        }
      }
      if ((local_20 != wrotepidfile) && (local_20 != -1)) {
        close(local_20);
      }
      if (wrotepidfile != -1) {
        close(wrotepidfile);
      }
      if (pidname._4_4_ != 0) {
        unlink(_error);
      }
      restore_signal_handlers();
      if (got_exit_signal != 0) {
        logmsg("============> socksd exits with signal (%d)",(ulong)(uint)exit_signal);
        raise(exit_signal);
      }
      logmsg("============> socksd quits");
      return 0;
    }
    iVar2 = strcmp("--version",_msgsock[endptr._4_4_]);
    if (iVar2 == 0) break;
    iVar2 = strcmp("--pidfile",_msgsock[endptr._4_4_]);
    if (iVar2 == 0) {
      iVar2 = endptr._4_4_ + 1;
      if (iVar2 < (int)argv_local) {
        _error = _msgsock[iVar2];
        iVar2 = endptr._4_4_ + 2;
      }
    }
    else {
      iVar2 = strcmp("--config",_msgsock[endptr._4_4_]);
      if (iVar2 == 0) {
        iVar2 = endptr._4_4_ + 1;
        if (iVar2 < (int)argv_local) {
          configfile = _msgsock[iVar2];
          iVar2 = endptr._4_4_ + 2;
        }
      }
      else {
        iVar2 = strcmp("--backend",_msgsock[endptr._4_4_]);
        if (iVar2 == 0) {
          iVar2 = endptr._4_4_ + 1;
          if (iVar2 < (int)argv_local) {
            backendaddr = _msgsock[iVar2];
            iVar2 = endptr._4_4_ + 2;
          }
        }
        else {
          iVar2 = strcmp("--backendport",_msgsock[endptr._4_4_]);
          if (iVar2 == 0) {
            iVar2 = endptr._4_4_ + 1;
            if (iVar2 < (int)argv_local) {
              endptr._4_4_ = endptr._4_4_ + 2;
              iVar2 = atoi(_msgsock[iVar2]);
              backendport = (unsigned_short)iVar2;
              iVar2 = endptr._4_4_;
            }
          }
          else {
            iVar2 = strcmp("--logfile",_msgsock[endptr._4_4_]);
            if (iVar2 == 0) {
              iVar2 = endptr._4_4_ + 1;
              if (iVar2 < (int)argv_local) {
                serverlogfile = _msgsock[iVar2];
                iVar2 = endptr._4_4_ + 2;
              }
            }
            else {
              iVar2 = strcmp("--ipv6",_msgsock[endptr._4_4_]);
              if (iVar2 == 0) {
                ipv_inuse = "IPv6";
                use_ipv6 = true;
                iVar2 = endptr._4_4_ + 1;
              }
              else {
                iVar2 = strcmp("--ipv4",_msgsock[endptr._4_4_]);
                if (iVar2 == 0) {
                  ipv_inuse = "IPv4";
                  use_ipv6 = false;
                  iVar2 = endptr._4_4_ + 1;
                }
                else {
                  iVar2 = strcmp("--port",_msgsock[endptr._4_4_]);
                  if (iVar2 != 0) {
                    puts(
                        "Usage: socksd [option]\n --backend [ipv4 addr]\n --backendport [TCP port]\n --config [file]\n --version\n --logfile [file]\n --pidfile [file]\n --ipv4\n --ipv6\n --bindonly\n --port [port]\n"
                        );
                    return 0;
                  }
                  endptr._4_4_ = endptr._4_4_ + 1;
                  iVar2 = endptr._4_4_;
                  if (endptr._4_4_ < (int)argv_local) {
                    ulnum_00 = strtoul(_msgsock[endptr._4_4_],(char **)&ulnum,10);
                    uVar1 = ulnum;
                    pcVar5 = _msgsock[endptr._4_4_];
                    sVar3 = strlen(_msgsock[endptr._4_4_]);
                    if (((char *)uVar1 != pcVar5 + sVar3) ||
                       ((ulnum_00 != 0 && ((ulnum_00 < 0x401 || (0xffff < ulnum_00)))))) {
                      curl_mfprintf(_stderr,"socksd: invalid --port argument (%s)\n",
                                    _msgsock[endptr._4_4_]);
                      return 0;
                    }
                    port = curlx_ultous(ulnum_00);
                    iVar2 = endptr._4_4_ + 1;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  curl_mprintf("socksd IPv4%s\n","/IPv6");
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
  curl_socket_t sock = CURL_SOCKET_BAD;
  curl_socket_t msgsock = CURL_SOCKET_BAD;
  int wrotepidfile = 0;
  const char *pidname = ".socksd.pid";
  bool juggle_again;
  int error;
  int arg = 1;

  while(argc>arg) {
    if(!strcmp("--version", argv[arg])) {
      printf("socksd IPv4%s\n",
#ifdef ENABLE_IPV6
             "/IPv6"
#else
             ""
#endif
             );
      return 0;
    }
    else if(!strcmp("--pidfile", argv[arg])) {
      arg++;
      if(argc>arg)
        pidname = argv[arg++];
    }
    else if(!strcmp("--config", argv[arg])) {
      arg++;
      if(argc>arg)
        configfile = argv[arg++];
    }
    else if(!strcmp("--backend", argv[arg])) {
      arg++;
      if(argc>arg)
        backendaddr = argv[arg++];
    }
    else if(!strcmp("--backendport", argv[arg])) {
      arg++;
      if(argc>arg)
        backendport = (unsigned short)atoi(argv[arg++]);
    }
    else if(!strcmp("--logfile", argv[arg])) {
      arg++;
      if(argc>arg)
        serverlogfile = argv[arg++];
    }
    else if(!strcmp("--ipv6", argv[arg])) {
#ifdef ENABLE_IPV6
      ipv_inuse = "IPv6";
      use_ipv6 = TRUE;
#endif
      arg++;
    }
    else if(!strcmp("--ipv4", argv[arg])) {
      /* for completeness, we support this option as well */
#ifdef ENABLE_IPV6
      ipv_inuse = "IPv4";
      use_ipv6 = FALSE;
#endif
      arg++;
    }
    else if(!strcmp("--port", argv[arg])) {
      arg++;
      if(argc>arg) {
        char *endptr;
        unsigned long ulnum = strtoul(argv[arg], &endptr, 10);
        if((endptr != argv[arg] + strlen(argv[arg])) ||
           ((ulnum != 0UL) && ((ulnum < 1025UL) || (ulnum > 65535UL)))) {
          fprintf(stderr, "socksd: invalid --port argument (%s)\n",
                  argv[arg]);
          return 0;
        }
        port = curlx_ultous(ulnum);
        arg++;
      }
    }
    else {
      puts("Usage: socksd [option]\n"
           " --backend [ipv4 addr]\n"
           " --backendport [TCP port]\n"
           " --config [file]\n"
           " --version\n"
           " --logfile [file]\n"
           " --pidfile [file]\n"
           " --ipv4\n"
           " --ipv6\n"
           " --bindonly\n"
           " --port [port]\n");
      return 0;
    }
  }

#ifdef WIN32
  win32_init();
  atexit(win32_cleanup);

  setmode(fileno(stdin), O_BINARY);
  setmode(fileno(stdout), O_BINARY);
  setmode(fileno(stderr), O_BINARY);
#endif

  install_signal_handlers();

#ifdef ENABLE_IPV6
  if(!use_ipv6)
#endif
    sock = socket(AF_INET, SOCK_STREAM, 0);
#ifdef ENABLE_IPV6
  else
    sock = socket(AF_INET6, SOCK_STREAM, 0);
#endif

  if(CURL_SOCKET_BAD == sock) {
    error = SOCKERRNO;
    logmsg("Error creating socket: (%d) %s",
           error, strerror(error));
    goto socks5_cleanup;
  }

  {
    /* passive daemon style */
    sock = sockdaemon(sock, &port);
    if(CURL_SOCKET_BAD == sock) {
      goto socks5_cleanup;
    }
    msgsock = CURL_SOCKET_BAD; /* no stream socket yet */
  }

  logmsg("Running %s version", ipv_inuse);
  logmsg("Listening on port %hu", port);

  wrotepidfile = write_pidfile(pidname);
  if(!wrotepidfile) {
    goto socks5_cleanup;
  }

  do {
    juggle_again = incoming(sock);
  } while(juggle_again);

socks5_cleanup:

  if((msgsock != sock) && (msgsock != CURL_SOCKET_BAD))
    sclose(msgsock);

  if(sock != CURL_SOCKET_BAD)
    sclose(sock);

  if(wrotepidfile)
    unlink(pidname);

  restore_signal_handlers();

  if(got_exit_signal) {
    logmsg("============> socksd exits with signal (%d)", exit_signal);
    /*
     * To properly set the return status of the process we
     * must raise the same signal SIGINT or SIGTERM that we
     * caught and let the old handler take care of it.
     */
    raise(exit_signal);
  }

  logmsg("============> socksd quits");
  return 0;
}